

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O1

int tnt_reply_from(tnt_reply *r,tnt_reply_t rcv,void *ptr)

{
  ushort *puVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ssize_t sVar8;
  char *pcVar9;
  long *in_RCX;
  mp_type *pmVar10;
  char ********ppppppppcVar11;
  long lVar12;
  long extraout_RDX;
  long extraout_RDX_00;
  size_t size;
  undefined8 unaff_RBX;
  byte *pbVar13;
  char ********ppppppppcVar14;
  char ********end;
  void *pvVar15;
  byte **data;
  tnt_reply *r_00;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  size_t size_00;
  ulong unaff_R13;
  char ********ppppppppcVar19;
  char ********ppppppppcStack_170;
  char *******pppppppcStack_168;
  char *******pppppppcStack_158;
  char *******pppppppcStack_150;
  ulong uStack_148;
  mp_type *pmStack_140;
  char ********ppppppppcStack_138;
  code *pcStack_130;
  char ********ppppppppcStack_120;
  mp_type *pmStack_118;
  char ********ppppppppcStack_110;
  byte **ppbStack_108;
  char ********ppppppppcStack_100;
  char ********ppppppppcStack_f8;
  char ********ppppppppcStack_f0;
  char ********ppppppppcStack_e8;
  char ********ppppppppcStack_e0;
  char ********ppppppppcStack_d8;
  char ********ppppppppcStack_d0;
  char ********ppppppppcStack_c8;
  ulong uStack_c0;
  char ********appppppppcStack_b8 [2];
  ulong uStack_a8;
  ulong uStack_a0;
  byte *pbStack_98;
  void *pvStack_90;
  code *apcStack_88 [2];
  byte *pbStack_78;
  ulong uStack_70;
  tnt_reply *ptStack_68;
  ulong uStack_60;
  code *pcStack_40;
  size_t local_38;
  size_t hdr_length;
  undefined4 uStack_28;
  char length [5];
  
  uStack_28 = (undefined4)unaff_RBX;
  length._1_4_ = (undefined4)((ulong)unaff_RBX >> 0x20);
  *(undefined8 *)r = 0;
  r->bitmap = 0;
  r->buf = (char *)0x0;
  r->buf_size = 0;
  r->code = 0;
  r->sync = 0;
  r->schema_id = 0;
  r->error = (char *)0x0;
  r->error_end = (char *)0x0;
  r->data = (char *)0x0;
  r->data_end = (char *)0x0;
  r->metadata = (char *)0x0;
  r->metadata_end = (char *)0x0;
  r->sqlinfo = (char *)0x0;
  r->sqlinfo_end = (char *)0x0;
  r->alloc = r->alloc;
  pbVar13 = (byte *)((long)&hdr_length + 3);
  pcStack_40 = (code *)0x113e7a;
  pvVar15 = ptr;
  sVar8 = (*rcv)(ptr,(char *)pbVar13,5);
  if ((sVar8 != -1) && (size_00 = (size_t)hdr_length._3_1_, mp_type_hint[size_00] == MP_UINT)) {
    switch(hdr_length._3_1_) {
    case 0xcc:
      size_00 = (size_t)hdr_length._4_1_;
      break;
    case 0xcd:
      size_00 = (size_t)(ushort)(CONCAT11(hdr_length._5_1_,hdr_length._4_1_) << 8 |
                                (ushort)hdr_length._5_1_);
      break;
    case 0xce:
      size_00 = (size_t)((uint)(hdr_length._6_2_ >> 8) | ((hdr_length._6_2_ & 0xff) << 0x10) >> 8 |
                         (CONCAT11(hdr_length._5_1_,hdr_length._4_1_) & 0xff00) << 8 |
                        CONCAT22(hdr_length._6_2_,CONCAT11(hdr_length._5_1_,hdr_length._4_1_)) <<
                        0x18);
      break;
    case 0xcf:
      uVar7 = CONCAT22(hdr_length._6_2_,CONCAT11(hdr_length._5_1_,hdr_length._4_1_));
      size_00 = (ulong)((uint)uStack_28 >> 0x18) |
                (((ulong)(uint)uStack_28 & 0xff0000) << 0x20) >> 0x28 |
                (((ulong)(uint)uStack_28 & 0xff00) << 0x20) >> 0x18 |
                (((ulong)(uint)uStack_28 & 0xff) << 0x20) >> 8 | ((ulong)uVar7 & 0xff000000) << 8 |
                ((ulong)uVar7 & 0xff0000) << 0x18 | ((ulong)uVar7 & 0xff00) << 0x28 |
                CONCAT44(uStack_28,uVar7) << 0x38;
      break;
    default:
      if ((char)hdr_length._3_1_ < '\0') {
        pcStack_40 = tnt_reply_hdr0;
        tnt_reply_from_cold_1();
        data = &pbStack_78;
        ppppppppcVar14 = (char ********)(pbVar13 + extraout_RDX);
        apcStack_88[0] = (code *)0x113fd0;
        pbStack_78 = pbVar13;
        ptStack_68 = r;
        uStack_60 = size_00;
        pcStack_40 = (code *)&stack0xfffffffffffffff8;
        iVar6 = mp_check((char **)data,(char *)ppppppppcVar14);
        if (iVar6 == 0) {
          bVar2 = *pbVar13;
          pmVar10 = mp_type_hint;
          if (mp_type_hint[bVar2] != MP_MAP) {
            return -1;
          }
          if (bVar2 == 0xdf) {
            uVar7 = *(uint *)(pbVar13 + 1);
            uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
            ppppppppcVar14 = (char ********)(pbVar13 + 5);
          }
          else if (bVar2 == 0xde) {
            ppppppppcVar14 = (char ********)(pbVar13 + 3);
            uVar7 = (uint)(ushort)(*(ushort *)(pbVar13 + 1) << 8 | *(ushort *)(pbVar13 + 1) >> 8);
          }
          else {
            if (-0x71 < (char)bVar2) {
LAB_00114271:
              apcStack_88[0] = (code *)0x114276;
              tnt_reply_hdr0_cold_5();
LAB_00114276:
              apcStack_88[0] = (code *)0x11427b;
              tnt_reply_hdr0_cold_3();
LAB_0011427b:
              apcStack_88[0] = (code *)0x114280;
              tnt_reply_hdr0_cold_2();
LAB_00114280:
              apcStack_88[0] = tnt_reply_body0;
              tnt_reply_hdr0_cold_1();
              end = (char ********)((long)ppppppppcVar14 + extraout_RDX_00);
              pcStack_130 = (code *)0x1142b5;
              ppppppppcStack_120 = ppppppppcVar14;
              appppppppcStack_b8[0] = ppppppppcVar14;
              uStack_a8 = size_00;
              uStack_a0 = unaff_R13;
              pbStack_98 = pbVar13;
              pvStack_90 = pvVar15;
              apcStack_88[0] = (code *)&pcStack_40;
              iVar6 = mp_check((char **)&ppppppppcStack_120,(char *)end);
              r_00 = (tnt_reply *)0xffffffff;
              if (iVar6 != 0) {
LAB_001147f8:
                return (int)r_00;
              }
              bVar2 = *(byte *)appppppppcStack_b8[0];
              uVar16 = (ulong)bVar2;
              if (mp_type_hint[uVar16] != MP_MAP) goto LAB_001147f8;
              ppppppppcVar11 = (char ********)((long)appppppppcStack_b8[0] + 1);
              pmStack_118 = pmVar10;
              ppppppppcStack_110 = ppppppppcVar14;
              ppbStack_108 = data;
              if (bVar2 == 0xdf) {
                uVar7 = *(uint *)((long)appppppppcStack_b8[0] + 1);
                uVar16 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                                uVar7 << 0x18);
                appppppppcStack_b8[0] = (char ********)((long)appppppppcStack_b8[0] + 5);
              }
              else if (bVar2 == 0xde) {
                uVar16 = (ulong)(ushort)(*(ushort *)((long)appppppppcStack_b8[0] + 1) << 8 |
                                        *(ushort *)((long)appppppppcStack_b8[0] + 1) >> 8);
                appppppppcStack_b8[0] = (char ********)((long)appppppppcStack_b8[0] + 3);
              }
              else {
                appppppppcStack_b8[0] = ppppppppcVar11;
                if (-0x71 < (char)bVar2) {
LAB_00114813:
                  pcStack_130 = tnt_reply;
                  tnt_reply_body0_cold_3();
                  uStack_148 = uVar16;
                  pmStack_140 = pmVar10;
                  ppppppppcStack_138 = ppppppppcVar14;
                  pcStack_130 = (code *)apcStack_88;
                  iVar6 = tnt_reply_len((char *)end,size,(size_t *)&pppppppcStack_150);
                  pppppppcStack_158 = pppppppcStack_150;
                  if (iVar6 == 0) {
                    if (r_00 == (tnt_reply *)0x0) {
                      iVar6 = 0;
                    }
                    else {
                      pppppppcStack_168 = (char *******)&pppppppcStack_158;
                      pppppppcStack_158 = (char *******)0x0;
                      ppppppppcStack_170 = end;
                      iVar6 = tnt_reply_from(r_00,tnt_reply_cb,&ppppppppcStack_170);
                    }
                  }
                  else {
                    if (iVar6 != 1) {
                      return -1;
                    }
                    iVar6 = 1;
                  }
                  if (ppppppppcVar11 != (char ********)0x0) {
                    *ppppppppcVar11 = pppppppcStack_158;
                  }
                  return iVar6;
                }
                uVar16 = (ulong)(bVar2 & 0xf);
              }
              ppppppppcStack_d0 = (char ********)0x0;
              ppppppppcStack_c8 = (char ********)0x0;
              ppppppppcStack_e8 = (char ********)0x0;
              ppppppppcStack_100 = (char ********)0x0;
              ppppppppcStack_e0 = (char ********)0x0;
              ppppppppcStack_f8 = (char ********)0x0;
              ppppppppcStack_d8 = (char ********)0x0;
              ppppppppcStack_f0 = (char ********)0x0;
              uVar18 = 0;
LAB_0011438a:
              r_00 = (tnt_reply *)0xffffffff;
              iVar6 = (int)uVar16;
              uVar16 = (ulong)(iVar6 - 1);
              if (iVar6 == 0) {
                if (ppbStack_108 != (byte **)0x0) {
                  ppbStack_108[7] = (byte *)ppppppppcStack_d0;
                  ppbStack_108[8] = (byte *)ppppppppcStack_c8;
                  ppbStack_108[9] = (byte *)ppppppppcStack_e8;
                  ppbStack_108[10] = (byte *)ppppppppcStack_100;
                  ppbStack_108[0xb] = (byte *)ppppppppcStack_e0;
                  ppbStack_108[0xc] = (byte *)ppppppppcStack_f8;
                  ppbStack_108[0xd] = (byte *)ppppppppcStack_d8;
                  ppbStack_108[0xe] = (byte *)ppppppppcStack_f0;
                  ppbStack_108[1] = (byte *)((ulong)ppbStack_108[1] | uVar18);
                }
                r_00 = (tnt_reply *)0x0;
                if (pmStack_118 != (mp_type *)0x0) {
                  *(long *)pmStack_118 = (long)appppppppcStack_b8[0] - (long)ppppppppcStack_110;
                }
                goto LAB_001147f8;
              }
              bVar2 = *(byte *)appppppppcStack_b8[0];
              pmVar10 = (mp_type *)(ulong)bVar2;
              ppppppppcVar19 = (char ********)((long)appppppppcStack_b8[0] + 1);
              ppppppppcVar11 = (char ********)(ulong)(bVar2 - 0xcc);
              switch(ppppppppcVar11) {
              case (char ********)0x0:
                pmVar10 = (mp_type *)(ulong)*(byte *)((long)appppppppcStack_b8[0] + 1);
                appppppppcStack_b8[0] = (char ********)((long)appppppppcStack_b8[0] + 2);
                break;
              case (char ********)0x1:
                puVar1 = (ushort *)((long)appppppppcStack_b8[0] + 1);
                appppppppcStack_b8[0] = (char ********)((long)appppppppcStack_b8[0] + 3);
                pmVar10 = (mp_type *)(ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
                break;
              case (char ********)0x2:
                uVar7 = *(uint *)((long)appppppppcStack_b8[0] + 1);
                pmVar10 = (mp_type *)
                          (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                                 uVar7 << 0x18);
                appppppppcStack_b8[0] = (char ********)((long)appppppppcStack_b8[0] + 5);
                break;
              case (char ********)0x3:
                uVar4 = *(ulong *)((long)appppppppcStack_b8[0] + 1);
                pmVar10 = (mp_type *)
                          (uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                           (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                           (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                           (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38);
                appppppppcStack_b8[0] = (char ********)((long)appppppppcStack_b8[0] + 9);
                break;
              default:
                appppppppcStack_b8[0] = ppppppppcVar19;
                if (-1 < (char)bVar2) break;
                pcStack_130 = (code *)0x11480e;
                tnt_reply_body0_cold_2();
                goto LAB_0011480e;
              }
              ppppppppcVar11 = appppppppcStack_b8[0];
              iVar6 = (int)pmVar10;
              if (iVar6 < 0x32) {
                if (iVar6 == 0x30) {
                  if (mp_type_hint[*(byte *)appppppppcStack_b8[0]] == MP_ARRAY) {
                    ppppppppcVar14 = (char ********)0x1;
                    do {
                      end = (char ********)((long)appppppppcStack_b8[0] + 1);
                      cVar3 = ""[*(byte *)appppppppcStack_b8[0]];
                      lVar12 = (long)cVar3;
                      if (lVar12 < 0) {
                        if (*(byte *)appppppppcStack_b8[0] == 0xd9) {
                          appppppppcStack_b8[0] =
                               (char ********)
                               ((long)appppppppcStack_b8[0] +
                               (ulong)*(byte *)((long)appppppppcStack_b8[0] + 1) + 2);
                          goto LAB_001145f0;
                        }
                        uStack_c0 = uVar18;
                        if (cVar3 < -0x1f) {
                          pcStack_130 = (code *)0x114641;
                          end = ppppppppcVar14;
                          mp_next_slowpath((char **)appppppppcStack_b8,(int64_t)ppppppppcVar14);
                        }
                        else {
                          ppppppppcVar14 = (char ********)((long)ppppppppcVar14 - lVar12);
                          appppppppcStack_b8[0] = end;
                        }
                        bVar5 = cVar3 >= -0x1f;
                        uVar18 = uStack_c0;
                      }
                      else {
                        end = (char ********)((long)end + lVar12);
                        appppppppcStack_b8[0] = end;
LAB_001145f0:
                        bVar5 = true;
                      }
                    } while ((bVar5) &&
                            (bVar5 = 1 < (long)ppppppppcVar14,
                            ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + -1), bVar5));
                    ppppppppcStack_100 = appppppppcStack_b8[0];
                    ppppppppcStack_e8 = ppppppppcVar11;
                    goto LAB_0011477c;
                  }
LAB_00114706:
                  bVar5 = false;
                  goto LAB_00114782;
                }
                if (iVar6 == 0x31) {
                  bVar2 = *(byte *)appppppppcStack_b8[0];
                  ppppppppcVar11 = ppppppppcVar14;
                  if (mp_type_hint[bVar2] != MP_STR) goto LAB_00114706;
                  ppppppppcVar19 = (char ********)((long)appppppppcStack_b8[0] + 1);
                  if (bVar2 == 0xdb) {
                    uVar7 = *(uint *)((long)appppppppcStack_b8[0] + 1);
                    uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                            uVar7 << 0x18;
                    appppppppcStack_b8[0] = (char ********)((long)appppppppcStack_b8[0] + 5);
                  }
                  else if (bVar2 == 0xda) {
                    puVar1 = (ushort *)((long)appppppppcStack_b8[0] + 1);
                    appppppppcStack_b8[0] = (char ********)((long)appppppppcStack_b8[0] + 3);
                    uVar7 = (uint)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
                  }
                  else if (bVar2 == 0xd9) {
                    uVar7 = (uint)*(byte *)((long)appppppppcStack_b8[0] + 1);
                    appppppppcStack_b8[0] = (char ********)((long)appppppppcStack_b8[0] + 2);
                  }
                  else {
                    ppppppppcVar11 = (char ********)(ulong)(bVar2 + 0x40);
                    appppppppcStack_b8[0] = ppppppppcVar19;
                    if ((byte)(bVar2 + 0x40) < 0xe0) {
LAB_0011480e:
                      pcStack_130 = (code *)0x114813;
                      tnt_reply_body0_cold_1();
                      goto LAB_00114813;
                    }
                    uVar7 = bVar2 & 0x1f;
                  }
                  ppppppppcStack_d0 = appppppppcStack_b8[0];
                  ppppppppcStack_c8 = (char ********)((ulong)uVar7 + (long)appppppppcStack_b8[0]);
                  ppppppppcVar11 = ppppppppcVar14;
                  appppppppcStack_b8[0] = ppppppppcStack_c8;
                  goto LAB_0011477c;
                }
LAB_0011451f:
                ppppppppcVar19 = (char ********)0x1;
                ppppppppcVar11 = ppppppppcVar14;
                do {
                  end = (char ********)((long)appppppppcStack_b8[0] + 1);
                  cVar3 = ""[*(byte *)appppppppcStack_b8[0]];
                  lVar12 = (long)cVar3;
                  if (lVar12 < 0) {
                    if (*(byte *)appppppppcStack_b8[0] == 0xd9) {
                      appppppppcStack_b8[0] =
                           (char ********)
                           ((long)appppppppcStack_b8[0] +
                           (ulong)*(byte *)((long)appppppppcStack_b8[0] + 1) + 2);
                      goto LAB_00114545;
                    }
                    uStack_c0 = uVar18;
                    if (cVar3 < -0x1f) {
                      pcStack_130 = (code *)0x114599;
                      end = ppppppppcVar19;
                      mp_next_slowpath((char **)appppppppcStack_b8,(int64_t)ppppppppcVar19);
                      ppppppppcVar11 = (char ********)appppppppcStack_b8;
                    }
                    else {
                      ppppppppcVar19 = (char ********)((long)ppppppppcVar19 - lVar12);
                      appppppppcStack_b8[0] = end;
                    }
                    bVar5 = cVar3 >= -0x1f;
                    uVar18 = uStack_c0;
                  }
                  else {
                    end = (char ********)((long)end + lVar12);
                    appppppppcStack_b8[0] = end;
LAB_00114545:
                    bVar5 = true;
                  }
                } while ((bVar5) &&
                        (bVar5 = 1 < (long)ppppppppcVar19,
                        ppppppppcVar19 = (char ********)((long)ppppppppcVar19 + -1), bVar5));
              }
              else if (iVar6 == 0x32) {
                if (mp_type_hint[*(byte *)appppppppcStack_b8[0]] != MP_ARRAY) goto LAB_00114706;
                ppppppppcVar14 = (char ********)0x1;
                do {
                  end = (char ********)((long)appppppppcStack_b8[0] + 1);
                  cVar3 = ""[*(byte *)appppppppcStack_b8[0]];
                  lVar12 = (long)cVar3;
                  if (lVar12 < 0) {
                    if (*(byte *)appppppppcStack_b8[0] == 0xd9) {
                      appppppppcStack_b8[0] =
                           (char ********)
                           ((long)appppppppcStack_b8[0] +
                           (ulong)*(byte *)((long)appppppppcStack_b8[0] + 1) + 2);
                      goto LAB_00114699;
                    }
                    uStack_c0 = uVar18;
                    if (cVar3 < -0x1f) {
                      pcStack_130 = (code *)0x1146e7;
                      end = ppppppppcVar14;
                      mp_next_slowpath((char **)appppppppcStack_b8,(int64_t)ppppppppcVar14);
                    }
                    else {
                      ppppppppcVar14 = (char ********)((long)ppppppppcVar14 - lVar12);
                      appppppppcStack_b8[0] = end;
                    }
                    bVar5 = cVar3 >= -0x1f;
                    uVar18 = uStack_c0;
                  }
                  else {
                    end = (char ********)((long)end + lVar12);
                    appppppppcStack_b8[0] = end;
LAB_00114699:
                    bVar5 = true;
                  }
                } while ((bVar5) &&
                        (bVar5 = 1 < (long)ppppppppcVar14,
                        ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + -1), bVar5));
                ppppppppcStack_f8 = appppppppcStack_b8[0];
                ppppppppcStack_e0 = ppppppppcVar11;
              }
              else {
                if (iVar6 != 0x42) goto LAB_0011451f;
                if (mp_type_hint[*(byte *)appppppppcStack_b8[0]] != MP_MAP) goto LAB_00114706;
                ppppppppcVar14 = (char ********)0x1;
                do {
                  end = (char ********)((long)appppppppcStack_b8[0] + 1);
                  cVar3 = ""[*(byte *)appppppppcStack_b8[0]];
                  lVar12 = (long)cVar3;
                  if (lVar12 < 0) {
                    if (*(byte *)appppppppcStack_b8[0] == 0xd9) {
                      appppppppcStack_b8[0] =
                           (char ********)
                           ((long)appppppppcStack_b8[0] +
                           (ulong)*(byte *)((long)appppppppcStack_b8[0] + 1) + 2);
                      goto LAB_001144af;
                    }
                    uStack_c0 = uVar18;
                    if (cVar3 < -0x1f) {
                      pcStack_130 = (code *)0x114500;
                      end = ppppppppcVar14;
                      mp_next_slowpath((char **)appppppppcStack_b8,(int64_t)ppppppppcVar14);
                    }
                    else {
                      ppppppppcVar14 = (char ********)((long)ppppppppcVar14 - lVar12);
                      appppppppcStack_b8[0] = end;
                    }
                    bVar5 = cVar3 >= -0x1f;
                    uVar18 = uStack_c0;
                  }
                  else {
                    end = (char ********)((long)end + lVar12);
                    appppppppcStack_b8[0] = end;
LAB_001144af:
                    bVar5 = true;
                  }
                } while ((bVar5) &&
                        (bVar5 = 1 < (long)ppppppppcVar14,
                        ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + -1), bVar5));
                ppppppppcStack_f0 = appppppppcStack_b8[0];
                ppppppppcStack_d8 = ppppppppcVar11;
              }
LAB_0011477c:
              uVar18 = uVar18 | 1L << ((ulong)pmVar10 & 0x3f);
              bVar5 = true;
LAB_00114782:
              r_00 = (tnt_reply *)0xffffffff;
              ppppppppcVar14 = ppppppppcVar11;
              if (!bVar5) goto LAB_001147f8;
              goto LAB_0011438a;
            }
            ppppppppcVar14 = (char ********)(pbVar13 + 1);
            uVar7 = bVar2 & 0xf;
          }
          iVar6 = uVar7 + 1;
          uStack_70 = 0;
          unaff_R13 = 0;
          uVar16 = 0;
          data = (byte **)0x0;
          do {
            iVar6 = iVar6 + -1;
            if (iVar6 == 0) {
              if (pvVar15 != (void *)0x0) {
                *(ulong *)((long)pvVar15 + 0x28) = uStack_70;
                *(ulong *)((long)pvVar15 + 0x20) = (ulong)((uint)unaff_R13 & 0x7fff);
                *(ulong *)((long)pvVar15 + 0x30) = uVar16;
                *(byte ***)((long)pvVar15 + 8) = data;
              }
              if (in_RCX == (long *)0x0) {
                return 0;
              }
              *in_RCX = (long)ppppppppcVar14 - (long)pbVar13;
              return 0;
            }
            bVar2 = *(byte *)ppppppppcVar14;
            uVar18 = (ulong)bVar2;
            if (mp_type_hint[uVar18] != MP_UINT) {
              return -1;
            }
            size_00 = (size_t)(bVar2 - 0xcc);
            switch(size_00) {
            case 0:
              uVar18 = (ulong)*(byte *)((long)ppppppppcVar14 + 1);
              ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 2);
              break;
            case 1:
              puVar1 = (ushort *)((long)ppppppppcVar14 + 1);
              ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 3);
              uVar18 = (ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
              break;
            case 2:
              uVar7 = *(uint *)((long)ppppppppcVar14 + 1);
              uVar18 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                              uVar7 << 0x18);
              ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 5);
              break;
            case 3:
              uVar18 = *(ulong *)((long)ppppppppcVar14 + 1);
              uVar18 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                       (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8;
              ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 9);
              break;
            default:
              if ((char)bVar2 < '\0') {
                apcStack_88[0] = (code *)0x114271;
                tnt_reply_hdr0_cold_4();
                goto LAB_00114271;
              }
              ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 1);
            }
            bVar2 = *(byte *)ppppppppcVar14;
            size_00 = (size_t)bVar2;
            if (mp_type_hint[size_00] == MP_UINT) {
              iVar17 = (int)uVar18;
              if (iVar17 == 0) {
                unaff_R13 = (ulong)(bVar2 - 0xcc);
                switch(unaff_R13) {
                case 0:
                  unaff_R13 = (ulong)*(byte *)((long)ppppppppcVar14 + 1);
LAB_00114162:
                  ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 2);
                  break;
                case 1:
                  puVar1 = (ushort *)((long)ppppppppcVar14 + 1);
                  ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 3);
                  unaff_R13 = (ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
                  break;
                case 2:
                  uVar7 = *(uint *)((long)ppppppppcVar14 + 1);
                  unaff_R13 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                      (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
LAB_00114191:
                  ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 5);
                  break;
                case 3:
                  uVar4 = *(ulong *)((long)ppppppppcVar14 + 1);
                  unaff_R13 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                              (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                              (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                              (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
LAB_001141c2:
                  ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 9);
                  break;
                default:
                  if ((char)bVar2 < '\0') goto LAB_0011427b;
                  ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 1);
                  unaff_R13 = size_00;
                }
              }
              else if (iVar17 == 5) {
                switch(bVar2) {
                case 0xcc:
                  uVar16 = (ulong)*(byte *)((long)ppppppppcVar14 + 1);
                  goto LAB_00114162;
                case 0xcd:
                  puVar1 = (ushort *)((long)ppppppppcVar14 + 1);
                  ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 3);
                  uVar16 = (ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
                  break;
                case 0xce:
                  uVar7 = *(uint *)((long)ppppppppcVar14 + 1);
                  uVar16 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                                  uVar7 << 0x18);
                  goto LAB_00114191;
                case 0xcf:
                  uVar16 = *(ulong *)((long)ppppppppcVar14 + 1);
                  uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                           (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                           (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                           (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
                  goto LAB_001141c2;
                default:
                  if ((char)bVar2 < '\0') goto LAB_00114280;
                  ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 1);
                  uVar16 = size_00;
                }
              }
              else {
                if (iVar17 != 1) goto LAB_00114108;
                switch(bVar2) {
                case 0xcc:
                  uStack_70 = (ulong)*(byte *)((long)ppppppppcVar14 + 1);
                  goto LAB_00114162;
                case 0xcd:
                  puVar1 = (ushort *)((long)ppppppppcVar14 + 1);
                  ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 3);
                  uStack_70 = (ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
                  break;
                case 0xce:
                  uVar7 = *(uint *)((long)ppppppppcVar14 + 1);
                  uStack_70 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                      (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                  goto LAB_00114191;
                case 0xcf:
                  uVar4 = *(ulong *)((long)ppppppppcVar14 + 1);
                  uStack_70 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                              (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                              (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                              (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
                  goto LAB_001141c2;
                default:
                  if ((char)bVar2 < '\0') goto LAB_00114276;
                  ppppppppcVar14 = (char ********)((long)ppppppppcVar14 + 1);
                  uStack_70 = size_00;
                }
              }
              data = (byte **)((ulong)data | 1L << (uVar18 & 0x3f));
              bVar5 = true;
            }
            else {
LAB_00114108:
              bVar5 = false;
            }
          } while (bVar5);
        }
        return -1;
      }
    }
    pcStack_40 = (code *)0x113ef0;
    pcVar9 = (char *)tnt_mem_alloc(size_00);
    r->buf = pcVar9;
    r->buf_size = size_00;
    if (pcVar9 != (char *)0x0) {
      pcStack_40 = (code *)0x113f09;
      sVar8 = (*rcv)(ptr,pcVar9,size_00);
      if (sVar8 != -1) {
        pcStack_40 = (code *)0x113f23;
        iVar6 = tnt_reply_hdr0(r,r->buf,r->buf_size,&local_38);
        if (iVar6 == 0) {
          if (size_00 == local_38) {
            return 0;
          }
          pcStack_40 = (code *)0x113f9c;
          iVar6 = tnt_reply_body0(r,r->buf + local_38,r->buf_size - local_38,(size_t *)0x0);
          if (iVar6 == 0) {
            return 0;
          }
        }
      }
    }
  }
  if (r->buf != (char *)0x0) {
    pcStack_40 = (code *)0x113f35;
    tnt_mem_free(r->buf);
  }
  *(undefined8 *)r = 0;
  r->bitmap = 0;
  r->buf = (char *)0x0;
  r->buf_size = 0;
  r->code = 0;
  r->sync = 0;
  r->schema_id = 0;
  r->error = (char *)0x0;
  r->error_end = (char *)0x0;
  r->data = (char *)0x0;
  r->data_end = (char *)0x0;
  r->metadata = (char *)0x0;
  r->metadata_end = (char *)0x0;
  r->sqlinfo = (char *)0x0;
  r->sqlinfo_end = (char *)0x0;
  r->alloc = r->alloc;
  return -1;
}

Assistant:

int tnt_reply_from(struct tnt_reply *r, tnt_reply_t rcv, void *ptr) {
	/* cleanup, before processing response */
	int alloc = r->alloc;
	memset(r, 0 , sizeof(struct tnt_reply));
	r->alloc = alloc;
	/* reading iproto header */
	char length[TNT_REPLY_IPROTO_HDR_SIZE]; const char *data = (const char *)length;
	if (rcv(ptr, length, sizeof(length)) == -1)
		goto rollback;
	if (mp_typeof(*length) != MP_UINT)
		goto rollback;
	size_t size = mp_decode_uint(&data);
	r->buf = tnt_mem_alloc(size);
	r->buf_size = size;
	if (r->buf == NULL)
		goto rollback;
	if(rcv(ptr, (char *)r->buf, size) == -1)
		goto rollback;
	size_t hdr_length;
	if (tnt_reply_hdr0(r, r->buf, r->buf_size, &hdr_length) != 0)
		goto rollback;
	if (size == (size_t)hdr_length)
		return 0; /* no body */
	if (tnt_reply_body0(r, r->buf + hdr_length, r->buf_size - hdr_length, NULL) != 0)
		goto rollback;

	return 0;
rollback:
	if (r->buf) tnt_mem_free((void *)r->buf);
	alloc = r->alloc;
	memset(r, 0, sizeof(struct tnt_reply));
	r->alloc = alloc;
	return -1;
}